

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::DOMNodeImpl::getTextContent(DOMNodeImpl *this)

{
  int iVar1;
  DOMDocument *pDVar2;
  undefined4 extraout_var;
  DOMNode *local_38;
  XMLCh *pzBuffer;
  XMLSize_t nBufferLength;
  DOMNodeImpl *this_local;
  XMLCh *pzBuffer_00;
  
  pzBuffer = (XMLCh *)0x0;
  nBufferLength = (XMLSize_t)this;
  getTextContent(this,(XMLCh *)0x0,(XMLSize_t *)&pzBuffer);
  pDVar2 = getOwnerDocument(this);
  if (pDVar2 == (DOMDocument *)0x0) {
    local_38 = (DOMNode *)0x0;
  }
  else {
    local_38 = &pDVar2[-1].super_DOMNode;
  }
  iVar1 = (*local_38->_vptr_DOMNode[4])(local_38,((long)pzBuffer + 1) * 2);
  pzBuffer_00 = (XMLCh *)CONCAT44(extraout_var,iVar1);
  getTextContent(this,pzBuffer_00,(XMLSize_t *)&pzBuffer);
  pzBuffer_00[(long)pzBuffer] = L'\0';
  return pzBuffer_00;
}

Assistant:

const XMLCh*     DOMNodeImpl::getTextContent() const
{
	XMLSize_t nBufferLength = 0;

	getTextContent(NULL, nBufferLength);
	XMLCh* pzBuffer = (XMLCh*)((DOMDocumentImpl*)getOwnerDocument())->allocate((nBufferLength+1) * sizeof(XMLCh));
	getTextContent(pzBuffer, nBufferLength);
	pzBuffer[nBufferLength] = 0;

	return pzBuffer;

}